

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void DisplayFunction54(Idx<Variable> variable,lua_State *L,int index,lua_Debug_54 *ar)

{
  bool bVar1;
  char *pcVar2;
  Variable *pVVar3;
  string *psVar4;
  byte bVar5;
  string *this;
  int paramIndex;
  uint uVar6;
  Idx<Variable> IVar7;
  Idx<Variable> variable_local;
  string sourceText;
  string showValue;
  Idx<Variable> source;
  Idx<Variable> ptr;
  string local_70;
  string what;
  
  variable_local._arena = variable._arena;
  variable_local.Raw = variable.Raw;
  if (ar->what != (char *)0x0) {
    std::__cxx11::string::string((string *)&what,ar->what,(allocator *)&showValue);
    bVar1 = std::operator==(&what,"Lua");
    if (bVar1) {
      bVar5 = 10;
      if (ar->nparams < 10) {
        bVar5 = ar->nparams;
      }
      std::__cxx11::string::string((string *)&showValue,"function(",(allocator *)&sourceText);
      (*lua_pushvalue)(L,index);
      for (uVar6 = 1; uVar6 - bVar5 != 1; uVar6 = uVar6 + 1) {
        pcVar2 = (*lua_getlocal)(L,(lua_Debug *)0x0,uVar6);
        if (pcVar2 != (char *)0x0) {
          std::__cxx11::string::append((char *)&showValue);
          if (uVar6 != bVar5) {
            std::__cxx11::string::append((char *)&showValue);
          }
        }
      }
      std::__cxx11::string::push_back((char)&showValue);
      pVVar3 = Idx<Variable>::operator->(&variable_local);
      std::__cxx11::string::_M_assign((string *)&pVVar3->value);
      pVVar3 = Idx<Variable>::operator->(&variable_local);
      pVVar3->valueType = 9;
      pVVar3 = Idx<Variable>::operator->(&variable_local);
      std::__cxx11::string::assign((char *)&pVVar3->valueTypeName);
      IVar7 = Arena<Variable>::Alloc(variable_local._arena);
      ptr._arena = IVar7._arena;
      ptr.Raw = IVar7.Raw;
      pVVar3 = Idx<Variable>::operator->(&ptr);
      pVVar3->nameType = 4;
      pVVar3 = Idx<Variable>::operator->(&ptr);
      pVVar3->valueType = 6;
      pVVar3 = Idx<Variable>::operator->(&ptr);
      std::__cxx11::string::assign((char *)&pVVar3->name);
      ToPointer_abi_cxx11_(&sourceText,L,index);
      pVVar3 = Idx<Variable>::operator->(&ptr);
      std::__cxx11::string::operator=((string *)&pVVar3->value,(string *)&sourceText);
      std::__cxx11::string::~string((string *)&sourceText);
      if (ar->source != (char *)0x0) {
        std::__cxx11::string::string((string *)&sourceText,ar->source,(allocator *)&local_70);
        if ((sourceText._M_string_length != 0) && (*sourceText._M_dataplus._M_p == '@')) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&sourceText);
          std::__cxx11::string::operator=((string *)&sourceText,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
        IVar7 = Arena<Variable>::Alloc(variable_local._arena);
        source._arena = IVar7._arena;
        source.Raw = IVar7.Raw;
        pVVar3 = Idx<Variable>::operator->(&source);
        pVVar3->nameType = 4;
        pVVar3 = Idx<Variable>::operator->(&source);
        pVVar3->valueType = 4;
        pVVar3 = Idx<Variable>::operator->(&source);
        std::__cxx11::string::assign((char *)&pVVar3->name);
        psVar4 = (string *)std::__cxx11::string::append((char *)&sourceText);
        std::__cxx11::to_string(&local_70,ar->linedefined);
        std::__cxx11::string::append(psVar4);
        pVVar3 = Idx<Variable>::operator->(&source);
        std::__cxx11::string::_M_assign((string *)&pVVar3->value);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&sourceText);
      }
      this = &showValue;
    }
    else {
      bVar1 = std::operator==(&what,"C");
      if (bVar1) {
        ToPointer_abi_cxx11_(&sourceText,L,index);
        std::operator+(&showValue,"C ",&sourceText);
        pVVar3 = Idx<Variable>::operator->(&variable_local);
        std::__cxx11::string::operator=((string *)&pVVar3->value,(string *)&showValue);
        std::__cxx11::string::~string((string *)&showValue);
        this = &sourceText;
      }
      else {
        ToPointer_abi_cxx11_(&showValue,L,index);
        pVVar3 = Idx<Variable>::operator->(&variable_local);
        this = &showValue;
        std::__cxx11::string::operator=((string *)&pVVar3->value,(string *)this);
      }
    }
    std::__cxx11::string::~string((string *)this);
    std::__cxx11::string::~string((string *)&what);
  }
  return;
}

Assistant:

void DisplayFunction54(Idx<Variable> variable, lua_State *L, int index, lua_Debug_54 &ar) {
	if (ar.what == nullptr) {
		return;
	}
	std::string what = ar.what;
	if (what == "Lua") {
		auto paramNum = ar.nparams > 10 ? 10 : ar.nparams;
		std::string showValue = "function(";
		lua_pushvalue(L, index);
		for (auto i = 0; i != paramNum; i++) {
			auto paramIndex = i + 1;
			auto paramName = lua_getlocal(L, nullptr, paramIndex);
			if (paramName) {
				showValue.append(paramName);
				if (paramIndex != paramNum) {
					showValue.append(", ");
				}
			}
		}
		showValue.push_back(')');
		variable->value = showValue;
		variable->valueType = 9;
		variable->valueTypeName = "function";
		// ptr
		auto ptr = variable.GetArena()->Alloc();
		ptr->nameType = LUA_TSTRING;
		ptr->valueType = LUA_TFUNCTION;
		ptr->name = "pointer";
		ptr->value = ToPointer(L, index);

		// source
		if (ar.source) {
			std::string sourceText = ar.source;
			if (!sourceText.empty() && sourceText.front() == '@') {
				sourceText = sourceText.substr(1);
			}
			auto source = variable.GetArena()->Alloc();
			source->nameType = LUA_TSTRING;
			source->valueType = LUA_TSTRING;
			source->name = "source";
			source->value = sourceText.append(":").append(std::to_string(ar.linedefined));
		}
	} else if (what == "C") {
		variable->value = "C " + ToPointer(L, index);
	} else {
		variable->value = ToPointer(L, index);
		return;
	}
}